

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
camp::BadArgument::BadArgument
          (BadArgument *this,Type provided,Type expected,size_t index,string *functionName)

{
  undefined1 local_178 [32];
  undefined1 local_158 [48];
  undefined1 local_128 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *functionName_local;
  size_t index_local;
  Type expected_local;
  Type provided_local;
  BadArgument *this_local;
  
  local_28 = functionName;
  functionName_local = (string *)index;
  index_local._0_4_ = expected;
  index_local._4_4_ = provided;
  _expected_local = this;
  Error::str<unsigned_long>((Error *)local_128,index);
  std::operator+(local_128 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "the argument #");
  std::operator+(local_e8,local_128 + 0x20);
  std::operator+(local_c8,local_e8);
  std::operator+(local_a8,(char *)local_c8);
  BadType::typeName_abi_cxx11_((BadType *)local_158,index_local._4_4_);
  std::operator+(local_88,local_a8);
  std::operator+(local_68,(char *)local_88);
  BadType::typeName_abi_cxx11_((BadType *)local_178,(Type)index_local);
  std::operator+(local_48,local_68);
  BadType::BadType(&this->super_BadType,local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)local_128);
  *(undefined ***)&(this->super_BadType).super_Error = &PTR__BadArgument_001fd358;
  return;
}

Assistant:

BadArgument::BadArgument(Type provided, Type expected, std::size_t index, const std::string& functionName)
    : BadType("the argument #" + str(index) + " of function " + functionName +
              " couldn't be converted from type " + typeName(provided) + " to type " + typeName(expected))
{
}